

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall adios2::IO::SetParameters(IO *this,Params *parameters)

{
  IO *pointer;
  allocator local_41;
  string local_40;
  
  pointer = this->m_IO;
  std::__cxx11::string::string((string *)&local_40,"in call to IO::SetParameters",&local_41);
  helper::CheckForNullptr<adios2::core::IO>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  adios2::core::IO::SetParameters(this->m_IO);
  return;
}

Assistant:

void IO::SetParameters(const Params &parameters)
{
    helper::CheckForNullptr(m_IO, "in call to IO::SetParameters");
    m_IO->SetParameters(parameters);
}